

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nginx.c
# Opt level: O1

void ngx_cleanup_environment(void *data)

{
  if (_environ != data) {
    free(data);
    return;
  }
  return;
}

Assistant:

static void
ngx_cleanup_environment(void *data)
{
    char  **env = data;

    if (environ == env) {

        /*
         * if the environment is still used, as it happens on exit,
         * the only option is to leak it
         */

        return;
    }

    ngx_free(env);
}